

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

void reportOptions(FILE *file,HighsLogOptions *log_options,
                  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
                  bool report_only_deviations,HighsFileType file_type)

{
  HighsOptionType HVar1;
  OptionRecordString *option;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)((long)(option_records->
                        super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl
                        .super__Vector_impl_data._M_finish -
                 (long)(option_records->
                       super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  uVar2 = 0;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    option = (OptionRecordString *)
             (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
             _M_impl.super__Vector_impl_data._M_start[uVar2];
    if ((option->super_OptionRecord).advanced == false) {
      HVar1 = (option->super_OptionRecord).type;
      if (HVar1 == kDouble) {
        reportOption(file,log_options,(OptionRecordDouble *)option,report_only_deviations,file_type)
        ;
      }
      else if (HVar1 == kInt) {
        reportOption(file,log_options,(OptionRecordInt *)option,report_only_deviations,file_type);
      }
      else if (HVar1 == kBool) {
        reportOption(file,log_options,(OptionRecordBool *)option,report_only_deviations,file_type);
      }
      else {
        reportOption(file,log_options,option,report_only_deviations,file_type);
      }
    }
  }
  return;
}

Assistant:

void reportOptions(FILE* file, const HighsLogOptions& log_options,
                   const std::vector<OptionRecord*>& option_records,
                   const bool report_only_deviations,
                   const HighsFileType file_type) {
  HighsInt num_options = option_records.size();
  for (HighsInt index = 0; index < num_options; index++) {
    HighsOptionType type = option_records[index]->type;
    // Only report non-advanced options
    if (option_records[index]->advanced) {
      // Possibly skip the advanced options when creating Md file
      if (!kAdvancedInDocumentation) continue;
    }
    if (type == HighsOptionType::kBool) {
      reportOption(file, log_options,
                   ((OptionRecordBool*)option_records[index])[0],
                   report_only_deviations, file_type);
    } else if (type == HighsOptionType::kInt) {
      reportOption(file, log_options,
                   ((OptionRecordInt*)option_records[index])[0],
                   report_only_deviations, file_type);
    } else if (type == HighsOptionType::kDouble) {
      reportOption(file, log_options,
                   ((OptionRecordDouble*)option_records[index])[0],
                   report_only_deviations, file_type);
    } else {
      reportOption(file, log_options,
                   ((OptionRecordString*)option_records[index])[0],
                   report_only_deviations, file_type);
    }
  }
}